

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsetChildren
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Prim *prim,token *familyName,bool prim_must_be_geommesh)

{
  bool bVar1;
  __type _Var2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  value_type *pvVar3;
  string *__lhs;
  string *__rhs;
  optional<tinyusdz::Token> local_a8;
  Token *local_80;
  token *tok;
  GeomSubset *local_50;
  GeomSubset *pv;
  Prim *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  bool prim_must_be_geommesh_local;
  token *familyName_local;
  Prim *prim_local;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *result;
  
  ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::vector
            (__return_storage_ptr__);
  if ((!prim_must_be_geommesh) || (bVar1 = Prim::is<tinyusdz::GeomMesh>(prim), bVar1)) {
    this = Prim::children(prim);
    __end2 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this);
    p = (Prim *)::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&p), bVar1) {
      pv = (GeomSubset *)
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
           ::operator*(&__end2);
      local_50 = Prim::as<tinyusdz::GeomSubset>((Prim *)pv);
      if (local_50 != (GeomSubset *)0x0) {
        bVar1 = Token::valid(familyName);
        if (bVar1) {
          bVar1 = TypedAttribute<tinyusdz::Token>::authored(&local_50->familyName);
          if (bVar1) {
            TypedAttribute<tinyusdz::Token>::get_value
                      ((optional<tinyusdz::Token> *)&tok,&local_50->familyName);
            bVar1 = nonstd::optional_lite::optional<tinyusdz::Token>::has_value
                              ((optional<tinyusdz::Token> *)&tok);
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)&tok);
            if (bVar1) {
              TypedAttribute<tinyusdz::Token>::get_value(&local_a8,&local_50->familyName);
              pvVar3 = nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_a8);
              nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_a8);
              local_80 = pvVar3;
              __lhs = Token::str_abi_cxx11_(familyName);
              __rhs = Token::str_abi_cxx11_(local_80);
              _Var2 = ::std::operator==(__lhs,__rhs);
              if (_Var2) {
                ::std::
                vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                ::push_back(__return_storage_ptr__,&local_50);
              }
            }
          }
          else {
            ::std::
            vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
            push_back(__return_storage_ptr__,&local_50);
          }
        }
        else {
          ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ::push_back(__return_storage_ptr__,&local_50);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsetChildren(
    const tinyusdz::Prim &prim, const tinyusdz::value::token &familyName,
    bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  if (prim_must_be_geommesh && !prim.is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : prim.children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}